

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O1

jtokentype getJsonToken(string *tokenVal,uint *consumed,char *raw,char *end)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  jtokentype jVar8;
  uint codepoint_;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  long in_FS_OFFSET;
  bool bVar12;
  JSONUTF8StringFilter writer;
  string numStr;
  JSONUTF8StringFilter local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tokenVal->_M_string_length = 0;
  *(tokenVal->_M_dataplus)._M_p = '\0';
  *consumed = 0;
  bVar12 = raw < end;
  if (bVar12) {
    lVar9 = 0;
    do {
      if ((0x20 < (ulong)(byte)raw[lVar9]) ||
         ((0x100002600U >> ((ulong)(byte)raw[lVar9] & 0x3f) & 1) == 0)) {
        if (bVar12) {
          pbVar10 = (byte *)(raw + lVar9);
          bVar2 = *pbVar10;
          jVar8 = JTOK_ERR;
          iVar6 = (int)lVar9;
          if (bVar2 < 0x5b) {
            switch(bVar2) {
            case 0x22:
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              local_58._M_string_length = 0;
              local_58.field_2._M_local_buf[0] = '\0';
              local_70.str = &local_58;
              local_70.is_valid = true;
              local_70.codepoint = 0;
              local_70.state = 0;
              local_70.surpair = 0;
              pbVar10 = (byte *)(raw + lVar9);
              goto LAB_001e647b;
            default:
              goto switchD_001e6238_caseD_23;
            case 0x2c:
              *consumed = iVar6 + 1;
              jVar8 = JTOK_COMMA;
              goto switchD_001e6238_caseD_23;
            case 0x2d:
            case 0x30:
            case 0x31:
            case 0x32:
            case 0x33:
            case 0x34:
            case 0x35:
            case 0x36:
            case 0x37:
            case 0x38:
            case 0x39:
              goto switchD_001e6238_caseD_2d;
            case 0x3a:
              *consumed = iVar6 + 1;
              jVar8 = JTOK_COLON;
              goto switchD_001e6238_caseD_23;
            }
          }
          if (bVar2 < 0x6e) {
            if (bVar2 == 0x5b) {
              *consumed = iVar6 + 1;
              jVar8 = JTOK_ARR_OPEN;
              goto switchD_001e6238_caseD_23;
            }
            if (bVar2 == 0x5d) {
              *consumed = iVar6 + 1;
              jVar8 = JTOK_ARR_CLOSE;
              goto switchD_001e6238_caseD_23;
            }
            if (bVar2 != 0x66) goto switchD_001e6238_caseD_23;
          }
          else {
            if (0x7a < bVar2) {
              if (bVar2 == 0x7d) {
                *consumed = iVar6 + 1;
                jVar8 = JTOK_OBJ_CLOSE;
              }
              else if (bVar2 == 0x7b) {
                *consumed = iVar6 + 1;
                jVar8 = JTOK_OBJ_OPEN;
              }
              goto switchD_001e6238_caseD_23;
            }
            if ((bVar2 != 0x6e) && (bVar2 != 0x74)) goto switchD_001e6238_caseD_23;
          }
          iVar3 = strncmp((char *)pbVar10,"null",4);
          if (iVar3 == 0) {
            *consumed = iVar6 + 4;
            jVar8 = JTOK_KW_NULL;
          }
          else {
            iVar3 = strncmp((char *)pbVar10,"true",4);
            if (iVar3 == 0) {
              *consumed = iVar6 + 4;
              jVar8 = JTOK_KW_TRUE;
            }
            else {
              iVar3 = strncmp((char *)pbVar10,"false",5);
              if (iVar3 == 0) {
                *consumed = iVar6 + 5;
                jVar8 = JTOK_KW_FALSE;
              }
            }
          }
          goto switchD_001e6238_caseD_23;
        }
        break;
      }
      lVar1 = lVar9 + 1;
      lVar9 = lVar9 + 1;
      bVar12 = raw + lVar1 < end;
    } while (raw + lVar1 != end);
  }
  jVar8 = JTOK_NONE;
  goto switchD_001e6238_caseD_23;
switchD_001e6238_caseD_2d:
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  pbVar11 = (byte *)(raw + lVar9 + 1);
  pbVar4 = pbVar11;
  if ((int)(char)bVar2 - 0x30U < 10) {
    pbVar4 = pbVar10;
  }
  if (((*pbVar4 == 0x30) && ((int)(char)pbVar4[1] - 0x30U < 10)) ||
     ((std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                 (&local_58,bVar2), pbVar11 < end && *pbVar10 == 0x2d &&
      (jVar8 = JTOK_ERR, 9 < (int)(char)*pbVar11 - 0x30U)))) goto switchD_001e64fe_caseD_6f;
  if (end <= pbVar11) goto LAB_001e662c;
  pbVar10 = (byte *)(raw + lVar9 + 2);
  goto LAB_001e62cd;
  while( true ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_58,bVar2);
    pbVar10 = pbVar11 + 1;
    if (end <= pbVar11) break;
LAB_001e62cd:
    pbVar11 = pbVar10;
    bVar2 = pbVar11[-1];
    if (9 < (int)(char)bVar2 - 0x30U) {
      if (bVar2 == 0x2e) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_58,'.');
        jVar8 = JTOK_ERR;
        if ((end <= pbVar11) || (9 < (int)(char)*pbVar11 - 0x30U)) goto switchD_001e64fe_caseD_6f;
        if (pbVar11 < end) {
          goto LAB_001e640a;
        }
      }
      else {
        pbVar11 = pbVar11 + -1;
      }
      break;
    }
  }
  goto LAB_001e662c;
LAB_001e647b:
  do {
    pbVar11 = pbVar10 + 1;
    if ((end <= pbVar11) || (bVar2 = *pbVar11, bVar2 < 0x20)) goto switchD_001e64fe_caseD_6f;
    if (bVar2 == 0x5c) {
      pbVar11 = pbVar10 + 2;
      if (end <= pbVar11) goto switchD_001e64fe_caseD_6f;
      bVar2 = *pbVar11;
      if (bVar2 < 0x62) {
        if (((bVar2 == 0x22) || (bVar2 == 0x2f)) || (bVar2 == 0x5c)) goto LAB_001e6575;
        goto switchD_001e64fe_caseD_6f;
      }
      switch(bVar2) {
      case 0x6e:
        bVar2 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_001e64fe_caseD_6f;
      case 0x72:
        bVar2 = 0xd;
        break;
      case 0x74:
        bVar2 = 9;
        break;
      case 0x75:
        goto switchD_001e64fe_caseD_75;
      default:
        if (bVar2 == 0x62) {
          bVar2 = 8;
        }
        else {
          if (bVar2 != 0x66) goto switchD_001e64fe_caseD_6f;
          bVar2 = 0xc;
        }
      }
LAB_001e6575:
      JSONUTF8StringFilter::push_back(&local_70,bVar2);
      pbVar10 = pbVar11;
      goto LAB_001e647b;
    }
    if (bVar2 == 0x22) {
      if (local_70.surpair != 0 || local_70.state != 0) {
        local_70.is_valid = false;
      }
      if (local_70.is_valid != false) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (tokenVal,&local_58);
        *consumed = ((int)pbVar10 + 2) - (int)raw;
        jVar8 = JTOK_STRING;
      }
      goto switchD_001e64fe_caseD_6f;
    }
    JSONUTF8StringFilter::push_back(&local_70,bVar2);
    pbVar10 = pbVar11;
  } while( true );
switchD_001e64fe_caseD_75:
  pbVar4 = pbVar10 + 7;
  codepoint_ = 0;
  if (pbVar4 < end) {
    lVar9 = 0;
    do {
      bVar2 = pbVar10[lVar9 + 3];
      iVar6 = (int)(char)bVar2;
      uVar7 = iVar6 - 0x30;
      if (uVar7 < 10) {
LAB_001e6551:
        codepoint_ = codepoint_ * 0x10 + uVar7;
        bVar12 = true;
      }
      else {
        if ((byte)(bVar2 + 0x9f) < 6) {
          uVar7 = iVar6 - 0x57;
          goto LAB_001e6551;
        }
        if ((byte)(bVar2 + 0xbf) < 6) {
          uVar7 = iVar6 - 0x37;
          goto LAB_001e6551;
        }
        bVar12 = false;
      }
      if (!bVar12) {
        pbVar5 = pbVar10 + lVar9 + 3;
        break;
      }
      lVar9 = lVar9 + 1;
      pbVar5 = pbVar4;
    } while (lVar9 != 4);
    if (pbVar5 == pbVar4) {
      JSONUTF8StringFilter::push_back_u(&local_70,codepoint_);
      pbVar11 = pbVar10 + 6;
      codepoint_ = 1;
    }
    else {
      codepoint_ = 0;
    }
  }
  pbVar10 = pbVar11;
  if ((char)codepoint_ == '\0') goto switchD_001e64fe_caseD_6f;
  goto LAB_001e647b;
  while( true ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_58,*pbVar11);
    pbVar11 = pbVar11 + 1;
    if (end <= pbVar11) break;
LAB_001e640a:
    if (9 < (int)(char)*pbVar11 - 0x30U) break;
  }
LAB_001e662c:
  if ((pbVar11 < end) && ((*pbVar11 | 0x20) == 0x65)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_58,*pbVar11);
    pbVar10 = pbVar11 + 1;
    if ((pbVar10 < end) && ((bVar2 = *pbVar10, bVar2 == 0x2d || (bVar2 == 0x2b)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_58,bVar2);
      pbVar10 = pbVar11 + 2;
    }
    pbVar11 = pbVar10;
    jVar8 = JTOK_ERR;
    if ((pbVar11 < end) && ((int)(char)*pbVar11 - 0x30U < 10)) {
      if (pbVar11 < end) {
        lVar9 = (long)end - (long)pbVar11;
        do {
          if (9 < (int)(char)*pbVar11 - 0x30U) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_58,*pbVar11);
          pbVar11 = pbVar11 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      goto LAB_001e66c4;
    }
  }
  else {
LAB_001e66c4:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (tokenVal,&local_58);
    *consumed = (int)pbVar11 - (int)raw;
    jVar8 = JTOK_NUMBER;
  }
switchD_001e64fe_caseD_6f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
switchD_001e6238_caseD_23:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return jVar8;
  }
  __stack_chk_fail();
}

Assistant:

enum jtokentype getJsonToken(std::string& tokenVal, unsigned int& consumed,
                            const char *raw, const char *end)
{
    tokenVal.clear();
    consumed = 0;

    const char *rawStart = raw;

    while (raw < end && (json_isspace(*raw)))          // skip whitespace
        raw++;

    if (raw >= end)
        return JTOK_NONE;

    switch (*raw) {

    case '{':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_OPEN;
    case '}':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_CLOSE;
    case '[':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_OPEN;
    case ']':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_CLOSE;

    case ':':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COLON;
    case ',':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COMMA;

    case 'n':
    case 't':
    case 'f':
        if (!strncmp(raw, "null", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_NULL;
        } else if (!strncmp(raw, "true", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_TRUE;
        } else if (!strncmp(raw, "false", 5)) {
            raw += 5;
            consumed = (raw - rawStart);
            return JTOK_KW_FALSE;
        } else
            return JTOK_ERR;

    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
        // part 1: int
        std::string numStr;

        const char *first = raw;

        const char *firstDigit = first;
        if (!json_isdigit(*firstDigit))
            firstDigit++;
        if ((*firstDigit == '0') && json_isdigit(firstDigit[1]))
            return JTOK_ERR;

        numStr += *raw;                       // copy first char
        raw++;

        if ((*first == '-') && (raw < end) && (!json_isdigit(*raw)))
            return JTOK_ERR;

        while (raw < end && json_isdigit(*raw)) {  // copy digits
            numStr += *raw;
            raw++;
        }

        // part 2: frac
        if (raw < end && *raw == '.') {
            numStr += *raw;                   // copy .
            raw++;

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        // part 3: exp
        if (raw < end && (*raw == 'e' || *raw == 'E')) {
            numStr += *raw;                   // copy E
            raw++;

            if (raw < end && (*raw == '-' || *raw == '+')) { // copy +/-
                numStr += *raw;
                raw++;
            }

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        tokenVal = numStr;
        consumed = (raw - rawStart);
        return JTOK_NUMBER;
        }

    case '"': {
        raw++;                                // skip "

        std::string valStr;
        JSONUTF8StringFilter writer(valStr);

        while (true) {
            if (raw >= end || (unsigned char)*raw < 0x20)
                return JTOK_ERR;

            else if (*raw == '\\') {
                raw++;                        // skip backslash

                if (raw >= end)
                    return JTOK_ERR;

                switch (*raw) {
                case '"':  writer.push_back('\"'); break;
                case '\\': writer.push_back('\\'); break;
                case '/':  writer.push_back('/'); break;
                case 'b':  writer.push_back('\b'); break;
                case 'f':  writer.push_back('\f'); break;
                case 'n':  writer.push_back('\n'); break;
                case 'r':  writer.push_back('\r'); break;
                case 't':  writer.push_back('\t'); break;

                case 'u': {
                    unsigned int codepoint;
                    if (raw + 1 + 4 >= end ||
                        hatoui(raw + 1, raw + 1 + 4, codepoint) !=
                               raw + 1 + 4)
                        return JTOK_ERR;
                    writer.push_back_u(codepoint);
                    raw += 4;
                    break;
                    }
                default:
                    return JTOK_ERR;

                }

                raw++;                        // skip esc'd char
            }

            else if (*raw == '"') {
                raw++;                        // skip "
                break;                        // stop scanning
            }

            else {
                writer.push_back(static_cast<unsigned char>(*raw));
                raw++;
            }
        }

        if (!writer.finalize())
            return JTOK_ERR;
        tokenVal = valStr;
        consumed = (raw - rawStart);
        return JTOK_STRING;
        }

    default:
        return JTOK_ERR;
    }
}